

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::IsLinearMapping
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,int side)

{
  int64_t iVar1;
  int *piVar2;
  long lVar3;
  int in_ESI;
  long in_RDI;
  int lowside;
  bool straight;
  TPZStack<int,_10> LowAllSides;
  size_t in_stack_00000358;
  char *in_stack_00000360;
  TPZStack<int,_10> *in_stack_ffffffffffffff48;
  TPZStack<int,_10> *in_stack_ffffffffffffff50;
  int local_78;
  TPZVec<int> local_60 [2];
  int local_14;
  byte local_1;
  
  local_14 = in_ESI;
  TPZStack<int,_10>::TPZStack(in_stack_ffffffffffffff50);
  pztopology::TPZQuadrilateral::LowerDimensionSides
            ((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_stack_ffffffffffffff48);
  if ((local_14 < 0) || (8 < local_14)) {
    pzinternal::DebugStopImpl(in_stack_00000360,in_stack_00000358);
    local_1 = 0;
  }
  else {
    if (3 < local_14) {
      iVar1 = TPZGeoElSideIndex::ElementIndex
                        ((TPZGeoElSideIndex *)(in_RDI + 0x30 + (long)(local_14 + -4) * 0x18));
      if (iVar1 != -1) {
        local_1 = 0;
        goto LAB_01654a40;
      }
    }
    local_78 = 0;
    while( true ) {
      iVar1 = TPZVec<int>::NElements(local_60);
      if (iVar1 <= local_78) break;
      piVar2 = TPZVec<int>::operator[](local_60,(long)local_78);
      if (3 < *piVar2) {
        lVar3 = in_RDI + 0x30;
        piVar2 = TPZVec<int>::operator[](local_60,(long)local_78);
        iVar1 = TPZGeoElSideIndex::ElementIndex
                          ((TPZGeoElSideIndex *)(lVar3 + (long)(*piVar2 + -4) * 0x18));
        if (iVar1 != -1) {
          local_1 = 0;
          goto LAB_01654a40;
        }
      }
      local_78 = local_78 + 1;
    }
    local_1 = 1;
  }
LAB_01654a40:
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1654a4a);
  return (bool)(local_1 & 1);
}

Assistant:

bool pzgeom::TPZGeoBlend<TGeo>::IsLinearMapping(int side) const
{
    TPZStack<int> LowAllSides;
    TGeo::LowerDimensionSides(side,LowAllSides);
    if(side < 0 || side > TGeo::NSides-1)
    {
        DebugStop();
        return 0;
    }
    bool straight = true;
    
    if(side >= TGeo::NNodes && fNeighbours[side-TGeo::NNodes].ElementIndex() != -1)
    {
        straight = false;
        return straight;
    }
    for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
    {
        if(LowAllSides[lowside] >= TGeo::NNodes && fNeighbours[LowAllSides[lowside]-TGeo::NNodes].ElementIndex() != -1)
        {
            straight = false;
            return straight;
        }
    }
    return straight;
}